

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_fragment_shading_rate_features
          (Impl *this,Value *state,VkPhysicalDeviceFragmentShadingRateFeaturesKHR **out_features)

{
  uint uVar1;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR *pVVar2;
  Type pGVar3;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR *features;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR **out_features_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>
                     (&this->allocator);
  *out_features = pVVar2;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"pipelineFragmentShadingRate");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->pipelineFragmentShadingRate = uVar1;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"primitiveFragmentShadingRate");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->primitiveFragmentShadingRate = uVar1;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"attachmentFragmentShadingRate");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->attachmentFragmentShadingRate = uVar1;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_fragment_shading_rate_features(
		const Value &state,
		VkPhysicalDeviceFragmentShadingRateFeaturesKHR **out_features)
{
	auto *features = allocator.allocate_cleared<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>();
	*out_features = features;

	features->pipelineFragmentShadingRate = state["pipelineFragmentShadingRate"].GetUint();
	features->primitiveFragmentShadingRate = state["primitiveFragmentShadingRate"].GetUint();
	features->attachmentFragmentShadingRate = state["attachmentFragmentShadingRate"].GetUint();
	return true;
}